

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall
xmrig::HttpServer::onConnection(HttpServer *this,uv_stream_t *stream,uint16_t param_2)

{
  HttpContext *this_00;
  
  this_00 = (HttpContext *)operator_new(0xe8);
  HttpContext::HttpContext(this_00,0,this->m_listener);
  uv_accept(stream,this_00->m_tcp);
  uv_read_start(this_00->m_tcp,onConnection::anon_class_1_0_00000001::__invoke,
                onConnection::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

void xmrig::HttpServer::onConnection(uv_stream_t *stream, uint16_t)
{
    HttpContext *ctx = new HttpContext(HTTP_REQUEST, m_listener);
    uv_accept(stream, ctx->stream());

    uv_read_start(ctx->stream(),
        [](uv_handle_t *, size_t suggested_size, uv_buf_t *buf)
        {
            buf->base = new char[suggested_size];

#           ifdef _WIN32
            buf->len = static_cast<unsigned int>(suggested_size);
#           else
            buf->len = suggested_size;
#           endif
        },
        [](uv_stream_t *tcp, ssize_t nread, const uv_buf_t *buf)
        {
            HttpContext *ctx = static_cast<HttpContext*>(tcp->data);

            if (nread >= 0) {
                const size_t size   = static_cast<size_t>(nread);
                const size_t parsed = ctx->parse(buf->base, size);

                if (parsed < size) {
                    ctx->close();
                }
            } else {
                ctx->close();
            }

            delete [] buf->base;
        });
}